

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRSDA.cpp
# Opt level: O3

void __thiscall chrono::ChLinkRSDA::CalcAngle(ChLinkRSDA *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ChBodyFrame *pCVar5;
  ChBodyFrame *pCVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  double dVar59;
  undefined1 auVar60 [16];
  double dVar61;
  ulong local_60;
  ulong local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  
  pCVar5 = (this->super_ChLink).Body1;
  dVar20 = (this->m_csys1).rot.m_data[0];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar20;
  dVar1 = (this->m_csys1).rot.m_data[1];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar1;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = (this->m_csys1).rot.m_data[2];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = (this->m_csys1).rot.m_data[3];
  pCVar6 = (this->super_ChLink).Body2;
  dVar2 = (pCVar5->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar2;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = (pCVar5->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  dVar3 = (pCVar5->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar3;
  dVar4 = (pCVar5->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar4;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar20 * dVar2;
  auVar15 = vfmadd231sd_fma(auVar51,auVar26,auVar35);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar1 * dVar2;
  auVar11 = vfmsub231sd_fma(auVar56,auVar26,auVar21);
  auVar15 = vfnmadd231sd_fma(auVar15,auVar46,auVar43);
  auVar13 = vfnmadd231sd_fma(auVar11,auVar40,auVar43);
  auVar11 = vfmadd231sd_fma(auVar15,auVar40,auVar48);
  auVar25 = vfnmadd231sd_fma(auVar13,auVar46,auVar48);
  auVar14 = vmulsd_avx512f(auVar11,auVar25);
  dVar59 = auVar11._0_8_;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar20 * dVar4;
  auVar15 = vfmadd231sd_fma(auVar52,auVar26,auVar43);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar20 * dVar3;
  auVar13 = vfmadd231sd_fma(auVar22,auVar26,auVar48);
  dVar20 = (this->m_csys2).rot.m_data[0];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar20;
  vmovsd_avx512f(auVar14);
  auVar15 = vfmadd231sd_fma(auVar15,auVar46,auVar35);
  auVar13 = vfnmadd231sd_fma(auVar13,auVar40,auVar35);
  dVar1 = (pCVar6->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar1;
  dVar2 = (this->m_csys2).rot.m_data[1];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar2;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = (this->m_csys2).rot.m_data[2];
  auVar26 = vfnmadd231sd_fma(auVar15,auVar30,auVar48);
  auVar13 = vfmadd231sd_fma(auVar13,auVar30,auVar43);
  dVar3 = (pCVar6->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar3;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = (pCVar6->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  dVar4 = (pCVar6->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar4;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = (this->m_csys2).rot.m_data[3];
  auVar15 = vmulsd_avx512f(auVar26,auVar26);
  auVar16 = vmulsd_avx512f(auVar25,auVar26);
  dVar61 = auVar13._0_8_;
  auVar17 = vfmadd231sd_avx512f(auVar15,auVar25,auVar25);
  vmovsd_avx512f(auVar16);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar2 * dVar1;
  auVar12 = vfmsub231sd_fma(auVar23,auVar31,auVar27);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar20 * dVar1;
  auVar15 = vfmadd231sd_fma(auVar54,auVar31,auVar41);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar20 * dVar3;
  auVar19 = vfmadd231sd_fma(auVar55,auVar31,auVar47);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar20 * dVar4;
  auVar10 = vfmadd231sd_fma(auVar18,auVar31,auVar53);
  auVar12 = vfnmadd231sd_fma(auVar12,auVar44,auVar47);
  auVar21 = vfnmadd231sd_fma(auVar15,auVar49,auVar47);
  auVar15 = vfmadd231sd_fma(auVar19,auVar49,auVar41);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar59 * dVar59;
  auVar19 = vfmadd231sd_fma(auVar32,auVar25,auVar25);
  auVar22 = vfnmadd231sd_fma(auVar10,auVar44,auVar41);
  auVar23 = vfnmadd231sd_fma(auVar12,auVar49,auVar53);
  auVar10 = vfmadd231sd_fma(auVar21,auVar44,auVar53);
  auVar28 = ZEXT816(0xbff0000000000000);
  auVar18 = vfmsub213sd_avx512f(auVar13,auVar11,auVar16);
  auVar27 = vfnmadd231sd_fma(auVar15,auVar36,auVar53);
  auVar29 = ZEXT816(0x4000000000000000);
  auVar12 = vfmadd231sd_fma(auVar22,auVar36,auVar47);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = auVar25._0_8_ * dVar61;
  auVar15 = vfmadd213sd_fma(auVar26,auVar11,auVar37);
  auVar16 = vfmsub231sd_fma(auVar37,auVar11,auVar26);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = auVar10._0_8_ * auVar10._0_8_;
  auVar21 = vfmadd231sd_fma(auVar60,auVar23,auVar23);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = auVar23._0_8_ * auVar12._0_8_;
  auVar22 = vfmadd231sd_fma(auVar57,auVar10,auVar27);
  auVar17 = vfmadd213sd_avx512f(auVar17,auVar29,auVar28);
  auVar11 = vfmadd213sd_fma(auVar19,auVar29,auVar28);
  auVar14 = vfmadd213sd_avx512f(auVar13,auVar26,auVar14);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = auVar27._0_8_ * auVar23._0_8_;
  auVar10 = vfmsub231sd_fma(auVar24,auVar10,auVar12);
  auVar13 = vfmadd213sd_fma(auVar21,auVar29,auVar28);
  dVar20 = auVar22._0_8_ + auVar22._0_8_;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar20;
  auVar19 = vmulsd_avx512f(auVar17,auVar58);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = auVar16._0_8_ + auVar16._0_8_;
  auVar19 = vfmadd231sd_fma(auVar19,auVar13,auVar38);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar20 * (auVar15._0_8_ + auVar15._0_8_);
  auVar15 = vfmadd231sd_fma(auVar42,auVar11,auVar13);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = auVar10._0_8_ + auVar10._0_8_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = auVar14._0_8_ + auVar14._0_8_;
  auVar11 = vfmadd231sd_fma(auVar19,auVar17,auVar50);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = auVar18._0_8_ + auVar18._0_8_;
  auVar13 = vfmadd231sd_fma(auVar15,auVar17,auVar45);
  dVar20 = asin(auVar11._0_8_);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = auVar11._0_8_;
  uVar7 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar15,2);
  bVar9 = (bool)((byte)uVar7 & 1);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar59;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = auVar13._0_8_;
  uVar7 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar11,6);
  bVar8 = (bool)((byte)uVar7 & 1);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = auVar25._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar61;
  this->m_angle =
       (double)((ulong)bVar8 *
                (long)((double)((ulong)bVar9 * 0x400921fb54442d18 +
                               (ulong)!bVar9 * -0x3ff6de04abbbd2e8) - dVar20) +
               (ulong)!bVar8 * (long)dVar20);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar61 * dVar61;
  auVar15 = vfmadd231sd_fma(auVar16,auVar14,auVar14);
  auVar15 = vfmadd132sd_fma(auVar15,ZEXT816(0xbff0000000000000),ZEXT816(0x4000000000000000));
  auVar28._8_8_ = 0;
  auVar28._0_8_ = auVar26._0_8_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_60;
  auVar13 = vfmsub213sd_fma(auVar28,auVar33,auVar13);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_50;
  auVar11 = vfmadd213sd_fma(auVar33,auVar39,auVar19);
  (this->m_axis).m_data[0] = auVar11._0_8_ + auVar11._0_8_;
  (this->m_axis).m_data[1] = auVar13._0_8_ + auVar13._0_8_;
  (this->m_axis).m_data[2] = auVar15._0_8_;
  ChFrameMoving<double>::GetWvel_par(&((this->super_ChLink).Body2)->super_ChFrameMoving<double>);
  ChFrameMoving<double>::GetWvel_par(&((this->super_ChLink).Body1)->super_ChFrameMoving<double>);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (this->m_axis).m_data[0];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_30 - local_48;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = (local_28 - local_40) * (this->m_axis).m_data[1];
  auVar15 = vfmadd231sd_fma(auVar29,auVar25,auVar10);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (this->m_axis).m_data[2];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_20 - local_38;
  auVar15 = vfmadd231sd_fma(auVar15,auVar34,auVar12);
  this->m_angle_dt = auVar15._0_8_;
  return;
}

Assistant:

void ChLinkRSDA::CalcAngle() {
    // Express the RSDA frames in absolute frame
    ChQuaternion<> rot1 = Body1->GetRot() * m_csys1.rot;
    ChQuaternion<> rot2 = Body2->GetRot() * m_csys2.rot;

    // Extract unit vectors
    auto f1 = rot1.GetXaxis();
    auto g1 = rot1.GetYaxis();
    auto f2 = rot2.GetXaxis();

    // Calculate sine and cosine of rotation angle
    double s = Vdot(g1, f2);
    double c = Vdot(f1, f2);

    // Get angle (in [-pi , +pi])
    double a = std::asin(s);
    if (c >= 0) {
        m_angle = a;
    } else {
        m_angle = (s >= 0) ? CH_C_PI - a : -CH_C_PI - a;
    }

    // Get angle rate of change
    m_axis = rot1.GetZaxis();
    m_angle_dt = Vdot(m_axis, Body2->GetWvel_par() - Body1->GetWvel_par());
}